

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O0

target_ulong_conflict
helper_addsc_mipsel(target_ulong_conflict rs,target_ulong_conflict rt,CPUMIPSState_conflict4 *env)

{
  _Bool flag;
  uint64_t tempRt;
  uint64_t tempRs;
  uint64_t temp;
  CPUMIPSState_conflict4 *env_local;
  target_ulong_conflict rt_local;
  target_ulong_conflict rs_local;
  
  set_DSPControl_carryflag(((ulong)rs + (ulong)rt & 0x100000000) != 0,env);
  return (target_ulong_conflict)((ulong)rs + (ulong)rt);
}

Assistant:

target_ulong helper_addsc(target_ulong rs, target_ulong rt, CPUMIPSState *env)
{
    uint64_t temp, tempRs, tempRt;
    bool flag;

    tempRs = (uint64_t)rs & MIPSDSP_LLO;
    tempRt = (uint64_t)rt & MIPSDSP_LLO;

    temp = tempRs + tempRt;
    flag = (temp & 0x0100000000ull) >> 32;
    set_DSPControl_carryflag(flag, env);

    return (target_long)(int32_t)(temp & MIPSDSP_LLO);
}